

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entry_noallocreadwithoffset(zip_t *zip,size_t offset,size_t size,void *buf)

{
  mz_zip_reader_extract_iter_state *pState;
  size_t sVar1;
  void *pvVar2;
  void *local_78;
  size_t read_size;
  size_t read_cursor;
  size_t nread;
  size_t to_read;
  size_t write_cursor;
  size_t file_offset;
  mz_uint8 *writebuf;
  mz_zip_reader_extract_iter_state *iter;
  mz_zip_archive *pzip;
  void *buf_local;
  size_t size_local;
  size_t offset_local;
  zip_t *zip_local;
  
  if (zip == (zip_t *)0x0) {
    zip_local = (zip_t *)0xffffffffffffffff;
  }
  else if (offset < (zip->entry).uncomp_size) {
    buf_local = (void *)size;
    if ((zip->entry).uncomp_size < offset + size) {
      buf_local = (void *)((zip->entry).uncomp_size - offset);
    }
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) && (-1 < (zip->entry).index)) {
      pState = mz_zip_reader_extract_iter_new(&zip->archive,(mz_uint)(zip->entry).index,0);
      if (pState == (mz_zip_reader_extract_iter_state *)0x0) {
        zip_local = (zip_t *)0xffffffffffffffde;
      }
      else {
        write_cursor = 0;
        to_read = 0;
        nread = (size_t)buf_local;
        size_local = offset;
        while ((write_cursor < (zip->entry).uncomp_size && nread != 0 &&
               (sVar1 = mz_zip_reader_extract_iter_read(pState,(void *)((long)buf + to_read),nread),
               sVar1 != 0))) {
          if (size_local < write_cursor + sVar1) {
            pvVar2 = (void *)(size_local - write_cursor);
            if (buf_local <= pvVar2) {
              __assert_fail("read_cursor < size",
                            "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/zip.c"
                            ,0x6a8,
                            "ssize_t zip_entry_noallocreadwithoffset(struct zip_t *, size_t, size_t, void *)"
                           );
            }
            local_78 = (void *)(sVar1 - (long)pvVar2);
            if (nread < local_78) {
              local_78 = (void *)nread;
            }
            if (buf_local < local_78) {
              __assert_fail("read_size <= size",
                            "/workspace/llm4binary/github/license_c_cmakelists/kuba--[P]zip/src/zip.c"
                            ,0x6ad,
                            "ssize_t zip_entry_noallocreadwithoffset(struct zip_t *, size_t, size_t, void *)"
                           );
            }
            if (pvVar2 != (void *)0x0) {
              memmove((void *)((long)buf + to_read),(void *)((long)buf + (long)pvVar2),
                      (size_t)local_78);
            }
            to_read = (long)local_78 + to_read;
            size_local = (long)local_78 + size_local;
            nread = nread - (long)local_78;
          }
          write_cursor = sVar1 + write_cursor;
        }
        mz_zip_reader_extract_iter_free(pState);
        zip_local = (zip_t *)to_read;
      }
    }
    else {
      zip_local = (zip_t *)0xfffffffffffffffd;
    }
  }
  else {
    zip_local = (zip_t *)0xffffffffffffffdf;
  }
  return (ssize_t)zip_local;
}

Assistant:

ssize_t zip_entry_noallocreadwithoffset(struct zip_t *zip, size_t offset,
                                        size_t size, void *buf) {
  mz_zip_archive *pzip = NULL;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  if (offset >= (size_t)zip->entry.uncomp_size) {
    return (ssize_t)ZIP_EINVAL;
  }

  if ((offset + size) > (size_t)zip->entry.uncomp_size) {
    size = (ssize_t)zip->entry.uncomp_size - offset;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  mz_zip_reader_extract_iter_state *iter =
      mz_zip_reader_extract_iter_new(pzip, (mz_uint)zip->entry.index, 0);
  if (!iter) {
    return (ssize_t)ZIP_ENORITER;
  }

  mz_uint8 *writebuf = (mz_uint8 *)buf;
  size_t file_offset = 0;
  size_t write_cursor = 0;
  size_t to_read = size;

  // iterate until the requested offset is in range
  while (file_offset < zip->entry.uncomp_size && to_read > 0) {
    size_t nread = mz_zip_reader_extract_iter_read(
        iter, (void *)&writebuf[write_cursor], to_read);

    if (nread == 0)
      break;

    if (offset < (file_offset + nread)) {
      size_t read_cursor = offset - file_offset;
      MZ_ASSERT(read_cursor < size);
      size_t read_size = nread - read_cursor;

      if (to_read < read_size)
        read_size = to_read;
      MZ_ASSERT(read_size <= size);

      // If it's an unaligned read (i.e. the first one)
      if (read_cursor != 0) {
        memmove(&writebuf[write_cursor], &writebuf[read_cursor], read_size);
      }

      write_cursor += read_size;
      offset += read_size;
      to_read -= read_size;
    }

    file_offset += nread;
  }

  mz_zip_reader_extract_iter_free(iter);
  return (ssize_t)write_cursor;
}